

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserPOMDPFormat_Spirit.h
# Opt level: O0

void __thiscall
POMDPFormatParsing::ParserPOMDPFormat_Spirit::AddAction::operator()
          (AddAction *this,iterator_t *str,iterator_t *end)

{
  string *name;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  *in_RDX;
  undefined8 *in_RDI;
  string s;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  *in_stack_fffffffffffffea0;
  POMDPDiscrete *this_00;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  *in_stack_fffffffffffffec0;
  allocator<char> *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  allocator<char> local_115 [173];
  allocator<char> *in_stack_ffffffffffffff98;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  *in_stack_ffffffffffffffa0;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  string local_38 [56];
  
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::position_iterator(in_stack_fffffffffffffec0,in_RDX);
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::position_iterator(in_stack_fffffffffffffec0,in_RDX);
  std::allocator<char>::allocator();
  std::__cxx11::string::
  string<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,void>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98);
  std::allocator<char>::~allocator(local_115);
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::~position_iterator(in_stack_fffffffffffffea0);
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::~position_iterator(in_stack_fffffffffffffea0);
  name = (string *)GetPOMDPDiscrete((ParserPOMDPFormat_Spirit *)*in_RDI);
  this_00 = (POMDPDiscrete *)&stack0xfffffffffffffec7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  POMDPDiscrete::AddSingleAgentAction(this_00,name,(string *)0xa6e3ee);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffec8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffec7);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void operator()(iterator_t str, iterator_t end) const
            {
                std::string s(str, end);
                _m_po->GetPOMDPDiscrete()->AddSingleAgentAction(s);
                if(DEBUG_POMDP_PARSE)
                    std::cout << "AddAction: added action "<<s<<" for agent "<<_m_po->_m_curAI<<std::endl;
            }